

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeSizeCase::test
          (VertexAttributeSizeCase *this)

{
  CallLogWrapper *this_00;
  TestLog *pTVar1;
  GLenum GVar2;
  ulong in_R8;
  long lVar3;
  allocator<char> local_142;
  allocator<char> local_141;
  ScopedLogSection section;
  GLuint vaos [2];
  GLuint buf;
  PointerData pointers [8];
  GLfloat vertexData [4];
  
  pointers[0].pointer = vertexData;
  pointers[0].size = 4;
  pointers[0].type = 0x1406;
  pointers[0].stride = 0;
  pointers[0].normalized = '\0';
  pointers[1].size = 3;
  pointers[1].type = 0x1406;
  pointers[1].stride = 0;
  pointers[1].normalized = '\0';
  pointers[2].size = 2;
  pointers[2].type = 0x1406;
  pointers[2].stride = 0;
  pointers[2].normalized = '\0';
  pointers[3].size = 1;
  pointers[3].type = 0x1406;
  pointers[3].stride = 0;
  pointers[3].normalized = '\0';
  pointers[4].size = 4;
  pointers[4].type = 0x1404;
  pointers[4].stride = 0;
  pointers[4].normalized = '\0';
  pointers[5].size = 3;
  pointers[5].type = 0x1404;
  pointers[5].stride = 0;
  pointers[5].normalized = '\0';
  pointers[6].size = 2;
  pointers[6].type = 0x1404;
  pointers[6].stride = 0;
  pointers[6].normalized = '\0';
  pointers[7].size = 1;
  pointers[7].type = 0x1404;
  pointers[7].stride = 0;
  vertexData[0] = 0.0;
  vertexData[1] = 0.0;
  vertexData[2] = 0.0;
  vertexData[3] = 0.0;
  pointers[7].normalized = '\0';
  pTVar1 = (this->super_ApiCase).m_log;
  pointers[1].pointer = pointers[0].pointer;
  pointers[2].pointer = pointers[0].pointer;
  pointers[3].pointer = pointers[0].pointer;
  pointers[4].pointer = pointers[0].pointer;
  pointers[5].pointer = pointers[0].pointer;
  pointers[6].pointer = pointers[0].pointer;
  pointers[7].pointer = pointers[0].pointer;
  std::__cxx11::string::string<std::allocator<char>>((string *)vaos,"DefaultVAO",&local_141);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"Test with default VAO",&local_142);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)vaos,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::~string((string *)vaos);
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  for (lVar3 = 0; GVar2 = (GLenum)in_R8, lVar3 != 0xc0; lVar3 = lVar3 + 0x18) {
    in_R8 = (ulong)(&pointers[0].normalized)[lVar3];
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)((long)&pointers[0].size + lVar3),
               *(GLenum *)((long)&pointers[0].type + lVar3),(&pointers[0].normalized)[lVar3],
               *(GLsizei *)((long)&pointers[0].stride + lVar3),
               *(void **)((long)&pointers[0].pointer + lVar3));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x8623,*(GLenum *)((long)&pointers[0].size + lVar3),(GLenum)in_R8);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = (this->super_ApiCase).m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)vaos,"WithVAO",&local_141);
  std::__cxx11::string::string<std::allocator<char>>((string *)&buf,"Test with VAO",&local_142);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)vaos,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::~string((string *)vaos);
  buf = 0;
  vaos[0] = 0;
  vaos[1] = 0;
  glu::CallLogWrapper::glGenVertexArrays(this_00,2,vaos);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&buf);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,buf);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,vaos[0]);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8623,4,GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glVertexAttribPointer
            (this_00,0,pointers[0].size,pointers[0].type,pointers[0].normalized,pointers[0].stride,
             (void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,vaos[1]);
  GVar2 = (GLenum)pointers[1].normalized;
  glu::CallLogWrapper::glVertexAttribPointer
            (this_00,0,pointers[1].size,pointers[1].type,pointers[1].normalized,pointers[1].stride,
             (void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8623,pointers[1].size,GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,vaos[0]);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8623,pointers[0].size,GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,2,vaos);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&buf);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return;
}

Assistant:

void test (void)
	{
		GLfloat vertexData[4] = {0.0f}; // never accessed

		const PointerData pointers[] =
		{
			// size test
			{ 4, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 3, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 2, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 1, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 4, GL_INT,		0,	GL_FALSE, vertexData },
			{ 3, GL_INT,		0,	GL_FALSE, vertexData },
			{ 2, GL_INT,		0,	GL_FALSE, vertexData },
			{ 1, GL_INT,		0,	GL_FALSE, vertexData },
		};

		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
			{
				glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
				expectError(GL_NO_ERROR);

				verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, pointers[ndx].size);
			}
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint buf		= 0;
			GLuint vaos[2]	= {0};

			glGenVertexArrays(2, vaos);
			glGenBuffers(1, &buf);
			glBindBuffer(GL_ARRAY_BUFFER, buf);
			expectError(GL_NO_ERROR);

			// initial
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, 4);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glVertexAttribPointer(0, pointers[0].size, pointers[0].type, pointers[0].normalized, pointers[0].stride, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribPointer(0, pointers[1].size, pointers[1].type, pointers[1].normalized, pointers[1].stride, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, pointers[1].size);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, pointers[0].size);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(1, &buf);
			expectError(GL_NO_ERROR);
		}
	}